

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

void __thiscall spv::Builder::accessChainStore(Builder *this,Id rvalue)

{
  Id lValue;
  Id target;
  uint vector;
  
  if ((this->accessChain).isRValue == false) {
    transferAccessChainSwizzle(this,true);
    lValue = collapseAccessChain(this);
    if ((this->accessChain).swizzle.
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (this->accessChain).swizzle.
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      vector = 0;
    }
    else {
      target = createLoad(this,lValue);
      vector = createLvalueSwizzle(this,(this->module).idToInstruction.
                                        super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start[target]->typeId,
                                   target,rvalue,&(this->accessChain).swizzle);
    }
    if ((this->accessChain).component != 0) {
      if (vector == 0) {
        vector = createLoad(this,lValue);
      }
      vector = createVectorInsertDynamic
                         (this,vector,
                          (this->module).idToInstruction.
                          super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[vector]->typeId,rvalue,
                          (this->accessChain).component);
    }
    if (vector != 0) {
      rvalue = vector;
    }
    createStore(this,rvalue,lValue);
    return;
  }
  __assert_fail("accessChain.isRValue == false",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/SpvBuilder.cpp"
                ,0x94e,"void spv::Builder::accessChainStore(Id)");
}

Assistant:

void Builder::accessChainStore(Id rvalue)
{
    assert(accessChain.isRValue == false);

    transferAccessChainSwizzle(true);
    Id base = collapseAccessChain();

    // If swizzle still exists, it is out-of-order or not full, we must load the target vector,
    // extract and insert elements to perform writeMask and/or swizzle.
    Id source = NoResult;
    if (accessChain.swizzle.size()) {
        Id tempBaseId = createLoad(base);
        source = createLvalueSwizzle(getTypeId(tempBaseId), tempBaseId, rvalue, accessChain.swizzle);
    }

    // dynamic component selection
    if (accessChain.component != NoResult) {
        Id tempBaseId = (source == NoResult) ? createLoad(base) : source;
        source = createVectorInsertDynamic(tempBaseId, getTypeId(tempBaseId), rvalue, accessChain.component);
    }

    if (source == NoResult)
        source = rvalue;

    createStore(source, base);
}